

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommandArguments.cxx
# Opt level: O0

void __thiscall
cmInstallCommandArguments::cmInstallCommandArguments
          (cmInstallCommandArguments *this,string *defaultComponent)

{
  static_string_view sVar1;
  string *defaultComponent_local;
  cmInstallCommandArguments *this_local;
  
  cmArgumentParser<void>::cmArgumentParser(&this->super_cmArgumentParser<void>);
  std::__cxx11::string::string((string *)&this->Destination);
  std::__cxx11::string::string((string *)&this->Component);
  std::__cxx11::string::string((string *)&this->NamelinkComponent);
  this->ExcludeFromAll = false;
  std::__cxx11::string::string((string *)&this->Rename);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->Permissions);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->Configurations);
  this->Optional = false;
  this->NamelinkOnly = false;
  this->NamelinkSkip = false;
  std::__cxx11::string::string((string *)&this->Type);
  std::__cxx11::string::string((string *)&this->DestinationString);
  std::__cxx11::string::string((string *)&this->PermissionsString);
  this->GenericArguments = (cmInstallCommandArguments *)0x0;
  std::__cxx11::string::string((string *)&this->DefaultComponentName,(string *)defaultComponent);
  sVar1 = ::cm::operator____s("DESTINATION",0xb);
  cmArgumentParser<void>::Bind<std::__cxx11::string>
            (&this->super_cmArgumentParser<void>,sVar1,&this->Destination);
  sVar1 = ::cm::operator____s("COMPONENT",9);
  cmArgumentParser<void>::Bind<std::__cxx11::string>
            (&this->super_cmArgumentParser<void>,sVar1,&this->Component);
  sVar1 = ::cm::operator____s("NAMELINK_COMPONENT",0x12);
  cmArgumentParser<void>::Bind<std::__cxx11::string>
            (&this->super_cmArgumentParser<void>,sVar1,&this->NamelinkComponent);
  sVar1 = ::cm::operator____s("EXCLUDE_FROM_ALL",0x10);
  cmArgumentParser<void>::Bind<bool>
            (&this->super_cmArgumentParser<void>,sVar1,&this->ExcludeFromAll);
  sVar1 = ::cm::operator____s("RENAME",6);
  cmArgumentParser<void>::Bind<std::__cxx11::string>
            (&this->super_cmArgumentParser<void>,sVar1,&this->Rename);
  sVar1 = ::cm::operator____s("PERMISSIONS",0xb);
  cmArgumentParser<void>::
  Bind<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&this->super_cmArgumentParser<void>,sVar1,&this->Permissions);
  sVar1 = ::cm::operator____s("CONFIGURATIONS",0xe);
  cmArgumentParser<void>::
  Bind<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&this->super_cmArgumentParser<void>,sVar1,&this->Configurations);
  sVar1 = ::cm::operator____s("OPTIONAL",8);
  cmArgumentParser<void>::Bind<bool>(&this->super_cmArgumentParser<void>,sVar1,&this->Optional);
  sVar1 = ::cm::operator____s("NAMELINK_ONLY",0xd);
  cmArgumentParser<void>::Bind<bool>(&this->super_cmArgumentParser<void>,sVar1,&this->NamelinkOnly);
  sVar1 = ::cm::operator____s("NAMELINK_SKIP",0xd);
  cmArgumentParser<void>::Bind<bool>(&this->super_cmArgumentParser<void>,sVar1,&this->NamelinkSkip);
  sVar1 = ::cm::operator____s("TYPE",4);
  cmArgumentParser<void>::Bind<std::__cxx11::string>
            (&this->super_cmArgumentParser<void>,sVar1,&this->Type);
  return;
}

Assistant:

cmInstallCommandArguments::cmInstallCommandArguments(
  std::string defaultComponent)
  : DefaultComponentName(std::move(defaultComponent))
{
  this->Bind("DESTINATION"_s, this->Destination);
  this->Bind("COMPONENT"_s, this->Component);
  this->Bind("NAMELINK_COMPONENT"_s, this->NamelinkComponent);
  this->Bind("EXCLUDE_FROM_ALL"_s, this->ExcludeFromAll);
  this->Bind("RENAME"_s, this->Rename);
  this->Bind("PERMISSIONS"_s, this->Permissions);
  this->Bind("CONFIGURATIONS"_s, this->Configurations);
  this->Bind("OPTIONAL"_s, this->Optional);
  this->Bind("NAMELINK_ONLY"_s, this->NamelinkOnly);
  this->Bind("NAMELINK_SKIP"_s, this->NamelinkSkip);
  this->Bind("TYPE"_s, this->Type);
}